

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O2

int gz_look(gz_statep state)

{
  z_stream *strm;
  uint uVar1;
  Bytef *__src;
  int iVar2;
  size_t __n;
  undefined8 uVar3;
  uchar *puVar4;
  uchar *__ptr;
  
  strm = &state->strm;
  if (state->size == 0) {
    uVar1 = state->want;
    puVar4 = (uchar *)malloc((ulong)uVar1);
    state->in = puVar4;
    __ptr = (uchar *)malloc((ulong)(uVar1 * 2));
    state->out = __ptr;
    if (puVar4 == (uchar *)0x0 || __ptr == (uchar *)0x0) {
      free(__ptr);
      free(puVar4);
LAB_00107775:
      gz_error(state,-4,"out of memory");
      return -1;
    }
    state->size = uVar1;
    (state->strm).avail_in = 0;
    (state->strm).next_in = (Bytef *)0x0;
    (state->strm).zalloc = (alloc_func)0x0;
    (state->strm).zfree = (free_func)0x0;
    (state->strm).opaque = (voidpf)0x0;
    iVar2 = inflateInit2_(strm,0x1f,"1.2.11",0x70);
    if (iVar2 != 0) {
      free(state->out);
      free(state->in);
      state->size = 0;
      goto LAB_00107775;
    }
  }
  uVar1 = (state->strm).avail_in;
  __n = (size_t)uVar1;
  if (uVar1 < 2) {
    iVar2 = gz_avail(state);
    if (iVar2 == -1) {
      return -1;
    }
    uVar1 = (state->strm).avail_in;
    __n = (size_t)uVar1;
    if (uVar1 == 0) {
      return 0;
    }
    if (uVar1 != 1) goto LAB_0010767d;
  }
  else {
LAB_0010767d:
    if ((*strm->next_in == '\x1f') && (strm->next_in[1] == 0x8b)) {
      inflateReset(strm);
      uVar3 = 0x200000000;
      goto LAB_001076d5;
    }
  }
  if (state->direct == 0) {
    (state->strm).avail_in = 0;
    state->eof = 1;
    (state->x).have = 0;
    return 0;
  }
  puVar4 = state->out;
  __src = (state->strm).next_in;
  (state->x).next = puVar4;
  memcpy(puVar4,__src,__n);
  (state->x).have = (state->strm).avail_in;
  (state->strm).avail_in = 0;
  uVar3 = 0x100000001;
LAB_001076d5:
  state->direct = (int)uVar3;
  state->how = (int)((ulong)uVar3 >> 0x20);
  return 0;
}

Assistant:

local int gz_look(state)
    gz_statep state;
{
    z_streamp strm = &(state->strm);

    /* allocate read buffers and inflate memory */
    if (state->size == 0) {
        /* allocate buffers */
        state->in = (unsigned char *)malloc(state->want);
        state->out = (unsigned char *)malloc(state->want << 1);
        if (state->in == NULL || state->out == NULL) {
            free(state->out);
            free(state->in);
            gz_error(state, Z_MEM_ERROR, "out of memory");
            return -1;
        }
        state->size = state->want;

        /* allocate inflate memory */
        state->strm.zalloc = Z_NULL;
        state->strm.zfree = Z_NULL;
        state->strm.opaque = Z_NULL;
        state->strm.avail_in = 0;
        state->strm.next_in = Z_NULL;
        if (inflateInit2(&(state->strm), 15 + 16) != Z_OK) {    /* gunzip */
            free(state->out);
            free(state->in);
            state->size = 0;
            gz_error(state, Z_MEM_ERROR, "out of memory");
            return -1;
        }
    }

    /* get at least the magic bytes in the input buffer */
    if (strm->avail_in < 2) {
        if (gz_avail(state) == -1)
            return -1;
        if (strm->avail_in == 0)
            return 0;
    }

    /* look for gzip magic bytes -- if there, do gzip decoding (note: there is
       a logical dilemma here when considering the case of a partially written
       gzip file, to wit, if a single 31 byte is written, then we cannot tell
       whether this is a single-byte file, or just a partially written gzip
       file -- for here we assume that if a gzip file is being written, then
       the header will be written in a single operation, so that reading a
       single byte is sufficient indication that it is not a gzip file) */
    if (strm->avail_in > 1 &&
            strm->next_in[0] == 31 && strm->next_in[1] == 139) {
        inflateReset(strm);
        state->how = GZIP;
        state->direct = 0;
        return 0;
    }

    /* no gzip header -- if we were decoding gzip before, then this is trailing
       garbage.  Ignore the trailing garbage and finish. */
    if (state->direct == 0) {
        strm->avail_in = 0;
        state->eof = 1;
        state->x.have = 0;
        return 0;
    }

    /* doing raw i/o, copy any leftover input to output -- this assumes that
       the output buffer is larger than the input buffer, which also assures
       space for gzungetc() */
    state->x.next = state->out;
    if (strm->avail_in) {
        memcpy(state->x.next, strm->next_in, strm->avail_in);
        state->x.have = strm->avail_in;
        strm->avail_in = 0;
    }
    state->how = COPY;
    state->direct = 1;
    return 0;
}